

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O0

bool __thiscall Inferences::ActiveOccurrenceIterator::hasNext(ActiveOccurrenceIterator *this)

{
  bool bVar1;
  const_reference cVar2;
  uint uVar3;
  Term *this_00;
  InductionTemplate *this_01;
  FunctionDefinitionHandler *in_RDI;
  uint i;
  vector<bool,_std::allocator<bool>_> *actPos;
  InductionTemplate *templ;
  Term *t;
  Term *in_stack_ffffffffffffffa8;
  Term *in_stack_ffffffffffffffb0;
  vector<bool,_std::allocator<bool>_> *local_40;
  undefined7 in_stack_ffffffffffffffc8;
  byte bVar4;
  uint local_24;
  
  while( true ) {
    bVar1 = Lib::Stack<Kernel::Term_*>::isEmpty
                      ((Stack<Kernel::Term_*> *)&(in_RDI->_templates)._deleted);
    bVar4 = 0;
    if (bVar1) {
      bVar1 = Lib::Stack<Kernel::Term_*>::isEmpty((Stack<Kernel::Term_*> *)(in_RDI + 1));
      bVar4 = bVar1 ^ 0xff;
    }
    if ((bVar4 & 1) == 0) break;
    this_00 = Lib::Stack<Kernel::Term_*>::pop((Stack<Kernel::Term_*> *)(in_RDI + 1));
    bVar1 = Kernel::Term::ground((Term *)0x7c6a5e);
    if (bVar1) {
      Lib::Stack<Kernel::Term_*>::push
                ((Stack<Kernel::Term_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    this_01 = Shell::FunctionDefinitionHandler::getInductionTemplate
                        (in_RDI,(Term *)CONCAT17(bVar4,in_stack_ffffffffffffffc8));
    if (this_01 == (InductionTemplate *)0x0) {
      local_40 = (vector<bool,_std::allocator<bool>_> *)0x0;
    }
    else {
      local_40 = Shell::InductionTemplate::inductionPositions(this_01);
    }
    for (local_24 = Kernel::Term::numTypeArguments(in_stack_ffffffffffffffb0);
        uVar3 = Kernel::Term::arity(this_00), local_24 < uVar3; local_24 = local_24 + 1) {
      if ((local_40 == (vector<bool,_std::allocator<bool>_> *)0x0) ||
         (cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)in_RDI,
                             CONCAT17(bVar4,in_stack_ffffffffffffffc8)), cVar2)) {
        Kernel::Term::nthArgument(this_00,local_24);
        bVar1 = Kernel::TermList::isTerm((TermList *)0x7c6b19);
        if (bVar1) {
          in_stack_ffffffffffffffb0 = (Term *)(in_RDI + 1);
          Kernel::Term::nthArgument(this_00,local_24);
          Kernel::TermList::term((TermList *)0x7c6b43);
          Lib::Stack<Kernel::Term_*>::push
                    ((Stack<Kernel::Term_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        }
      }
    }
  }
  bVar1 = Lib::Stack<Kernel::Term_*>::isEmpty
                    ((Stack<Kernel::Term_*> *)&(in_RDI->_templates)._deleted);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool ActiveOccurrenceIterator::hasNext() {
  while (_returnStack.isEmpty() && !_processStack.isEmpty()) {
    Term* t = _processStack.pop();
    if (t->ground()) {
      _returnStack.push(t);
    }
    InductionTemplate* templ = _fnDefHandler.getInductionTemplate(t);
    const vector<bool>* actPos = templ ? &templ->inductionPositions() : nullptr;
    for (unsigned i = t->numTypeArguments(); i < t->arity(); i++) {
      if ((!actPos || (*actPos)[i]) && t->nthArgument(i)->isTerm()) {
        _processStack.push(t->nthArgument(i)->term());
      }
    }
  }
  return !_returnStack.isEmpty();
}